

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::Matcher<const_phmap::priv::hash_internal::EnumClass_&>::Matcher
          (Matcher<const_phmap::priv::hash_internal::EnumClass_&> *this,EnumClass *value)

{
  MatcherBase<const_phmap::priv::hash_internal::EnumClass_&> local_28;
  
  (this->super_MatcherBase<const_phmap::priv::hash_internal::EnumClass_&>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<const_phmap::priv::hash_internal::EnumClass_&>).buffer_.ptr = (void *)0x0
  ;
  (this->super_MatcherBase<const_phmap::priv::hash_internal::EnumClass_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00232650;
  local_28.buffer_.i = *value;
  local_28.vtable_ =
       (VTable *)
       internal::MatcherBase<phmap::priv::hash_internal::EnumClass_const&>::
       GetVTable<testing::internal::MatcherBase<phmap::priv::hash_internal::EnumClass_const&>::ValuePolicy<testing::internal::EqMatcher<phmap::priv::hash_internal::EnumClass>,true>>()
       ::kVTable;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00232650;
  internal::MatcherBase<const_phmap::priv::hash_internal::EnumClass_&>::operator=
            (&this->super_MatcherBase<const_phmap::priv::hash_internal::EnumClass_&>,&local_28);
  internal::MatcherBase<const_phmap::priv::hash_internal::EnumClass_&>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}